

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rshapes.c
# Opt level: O2

void DrawRectangleRoundedLinesEx
               (Rectangle rec,float roundness,int segments,float lineThick,Color color)

{
  uchar y;
  uchar z;
  undefined8 uVar1;
  undefined8 uVar2;
  int i;
  int iVar3;
  long lVar5;
  ulong uVar6;
  uchar x;
  uchar w;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float in_XMM0_Dc;
  float in_XMM0_Dd;
  float fVar17;
  float __x;
  float in_XMM1_Dc;
  float in_XMM1_Dd;
  float x_00;
  float fVar18;
  float fVar19;
  float y_00;
  float fVar20;
  Rectangle rec_00;
  float local_1ec;
  float local_1e8;
  float fStack_1e4;
  float local_1d8;
  float fStack_1d4;
  undefined1 local_198 [16];
  undefined8 local_128;
  float local_120;
  float local_11c;
  undefined8 local_118;
  float local_110;
  float local_10c;
  float local_108 [7];
  undefined8 local_ec;
  float local_e4;
  float local_e0;
  float local_dc;
  float local_d8;
  float local_d4;
  float local_d0;
  float local_cc;
  float local_c8;
  float local_c4;
  float local_c0;
  float local_bc;
  float local_b8;
  float local_b4;
  float local_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  float local_a0;
  float local_9c;
  float local_98;
  float local_94;
  float local_90;
  float local_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  ulong uVar4;
  
  fVar18 = rec.width;
  fVar17 = rec.height;
  fVar10 = rec.x;
  fVar16 = rec.y;
  fVar20 = 0.0;
  if (0.0 <= lineThick) {
    fVar20 = lineThick;
  }
  if (roundness <= 0.0) {
    rec_00.width = fVar20 + fVar20 + fVar18;
    rec_00.height = fVar20 + fVar20 + fVar17;
    rec_00.y = fVar16 - fVar20;
    rec_00.x = fVar10 - fVar20;
    DrawRectangleLinesEx(rec_00,fVar20,color);
    return;
  }
  fVar19 = 1.0;
  if (roundness <= 1.0) {
    fVar19 = roundness;
  }
  fVar11 = fVar17;
  if (fVar18 <= fVar17) {
    fVar11 = fVar18;
  }
  fVar19 = fVar11 * fVar19 * 0.5;
  if (0.0 < fVar19) {
    y = color.g;
    z = color.b;
    if (segments < 4) {
      fVar11 = 1.0 - 0.5 / fVar19;
      fVar11 = fVar11 * fVar11;
      local_198._8_4_ = in_XMM0_Dc;
      local_198._0_8_ = rec._0_8_;
      local_198._12_4_ = in_XMM0_Dd;
      fVar11 = acosf(fVar11 + fVar11 + -1.0);
      fVar11 = ceilf(6.2831855 / fVar11);
      segments = 4;
      if (0 < (int)(fVar11 * 0.5)) {
        segments = (int)(fVar11 * 0.5);
      }
    }
    fVar11 = (float)segments;
    fVar12 = fVar19 + fVar20;
    fVar18 = fVar18 + fVar10;
    fStack_a4 = fVar17 + fVar16;
    fStack_60 = in_XMM1_Dc + in_XMM0_Dc;
    fStack_5c = in_XMM1_Dd + in_XMM0_Dd;
    fVar17 = fVar18 - fVar19;
    local_10c = fStack_a4 - fVar19;
    x_00 = fVar19 + fVar10;
    local_11c = fVar19 + fVar16;
    y_00 = fVar16 - fVar20;
    local_108[4] = fVar18 + fVar20;
    local_ec = CONCAT44(fVar17,local_10c);
    local_e4 = fStack_a4 + fVar20;
    local_d8 = fVar10 - fVar20;
    local_128 = CONCAT44(local_11c,x_00);
    local_118 = CONCAT44(local_10c,fVar17);
    w = color.a;
    x = color.r;
    local_120 = fVar17;
    local_110 = x_00;
    local_108[0] = x_00;
    local_108[1] = y_00;
    local_108[2] = fVar17;
    local_108[3] = y_00;
    local_108[5] = local_11c;
    local_108[6] = local_108[4];
    local_e0 = x_00;
    local_dc = local_e4;
    local_d4 = local_10c;
    local_d0 = local_d8;
    local_cc = local_11c;
    local_c8 = x_00;
    local_c4 = fVar16;
    local_c0 = fVar17;
    local_bc = fVar16;
    local_b8 = fVar18;
    local_b4 = local_11c;
    local_b0 = fVar18;
    fStack_ac = local_10c;
    fStack_a8 = fVar17;
    local_a0 = x_00;
    local_9c = fStack_a4;
    local_98 = fVar10;
    local_94 = local_10c;
    local_90 = fVar10;
    local_8c = local_11c;
    if (fVar20 <= 1.0) {
      rlBegin(1);
      lVar5 = 0;
      if (segments < 1) {
        segments = 0;
      }
      for (; lVar5 != 4; lVar5 = lVar5 + 1) {
        local_198._0_4_ = (&DAT_0017df80)[lVar5];
        fVar20 = *(float *)(&local_128 + lVar5);
        fVar10 = *(float *)((long)&local_128 + lVar5 * 8 + 4);
        uVar7 = segments;
        while (bVar9 = uVar7 != 0, uVar7 = uVar7 - 1, bVar9) {
          rlColor4ub(x,y,z,w);
          fVar16 = cosf((float)local_198._0_4_ * 0.017453292);
          fVar18 = sinf((float)local_198._0_4_ * 0.017453292);
          rlVertex2f(fVar16 * fVar12 + fVar20,fVar18 * fVar12 + fVar10);
          fVar16 = (float)local_198._0_4_ + 90.0 / fVar11;
          local_198._0_4_ = fVar16;
          fVar16 = fVar16 * 0.017453292;
          fVar18 = cosf(fVar16);
          fVar16 = sinf(fVar16);
          rlVertex2f(fVar18 * fVar12 + fVar20,fVar16 * fVar12 + fVar10);
        }
      }
      for (uVar6 = 0; uVar6 < 8; uVar6 = uVar6 + 2) {
        rlColor4ub(x,y,z,w);
        rlVertex2f(local_108[uVar6 * 2],local_108[uVar6 * 2 + 1]);
        rlVertex2f(local_108[uVar6 * 2 + 2],local_108[uVar6 * 2 + 3]);
      }
      rlEnd();
    }
    else {
      local_88 = local_11c;
      fStack_84 = local_11c;
      fStack_80 = local_11c;
      fStack_7c = local_11c;
      local_78 = local_10c;
      fStack_74 = local_10c;
      fStack_70 = local_10c;
      fStack_6c = local_10c;
      local_68 = local_108[4];
      fStack_64 = fStack_a4;
      local_58 = local_e4;
      fStack_54 = fStack_a4;
      fStack_50 = fStack_a4;
      fStack_4c = fStack_a4;
      local_48 = fStack_a4;
      fStack_44 = fStack_a4;
      fStack_40 = fStack_a4;
      fStack_3c = fStack_a4;
      rlSetTexture(texShapes.id);
      uVar2 = texShapesRec._8_8_;
      uVar1 = texShapesRec._0_8_;
      rlBegin(7);
      local_1d8 = (float)uVar1;
      fStack_1d4 = SUB84(uVar1,4);
      local_1e8 = (float)uVar2;
      fStack_1e4 = SUB84(uVar2,4);
      local_1e8 = local_1e8 + local_1d8;
      fStack_1e4 = fStack_1e4 + fStack_1d4;
      uVar8 = 0;
      uVar6 = (ulong)(uint)segments;
      if (segments < 1) {
        uVar6 = uVar8;
      }
      for (; uVar8 != 4; uVar8 = uVar8 + 1) {
        local_1ec = (float)(&DAT_0017df80)[uVar8];
        fVar20 = *(float *)(&local_128 + uVar8);
        fVar10 = *(float *)((long)&local_128 + uVar8 * 8 + 4);
        uVar4 = uVar6;
        while (iVar3 = (int)uVar4, uVar4 = (ulong)(iVar3 - 1), iVar3 != 0) {
          rlColor4ub(x,y,z,w);
          rlTexCoord2f(local_1d8 / (float)texShapes.width,fStack_1d4 / (float)texShapes.height);
          __x = local_1ec * 0.017453292;
          fVar13 = cosf(__x);
          fVar14 = sinf(__x);
          rlVertex2f(fVar13 * fVar19 + fVar20,fVar14 * fVar19 + fVar10);
          rlTexCoord2f(local_1e8 / (float)texShapes.width,fStack_1d4 / (float)texShapes.height);
          local_1ec = local_1ec + 90.0 / fVar11;
          fVar13 = local_1ec * 0.017453292;
          fVar14 = cosf(fVar13);
          fVar15 = sinf(fVar13);
          rlVertex2f(fVar14 * fVar19 + fVar20,fVar15 * fVar19 + fVar10);
          rlTexCoord2f(local_1e8 / (float)texShapes.width,fStack_1e4 / (float)texShapes.height);
          fVar14 = cosf(fVar13);
          fVar13 = sinf(fVar13);
          rlVertex2f(fVar14 * fVar12 + fVar20,fVar13 * fVar12 + fVar10);
          rlTexCoord2f(local_1d8 / (float)texShapes.width,fStack_1e4 / (float)texShapes.height);
          fVar13 = cosf(__x);
          fVar14 = sinf(__x);
          rlVertex2f(fVar13 * fVar12 + fVar20,fVar14 * fVar12 + fVar10);
        }
      }
      rlColor4ub(x,y,z,w);
      rlTexCoord2f(local_1d8 / (float)texShapes.width,fStack_1d4 / (float)texShapes.height);
      rlVertex2f(x_00,y_00);
      rlTexCoord2f(local_1d8 / (float)texShapes.width,fStack_1e4 / (float)texShapes.height);
      rlVertex2f(x_00,fVar16);
      rlTexCoord2f(local_1e8 / (float)texShapes.width,fStack_1e4 / (float)texShapes.height);
      rlVertex2f(fVar17,fVar16);
      rlTexCoord2f(local_1e8 / (float)texShapes.width,fStack_1d4 / (float)texShapes.height);
      rlVertex2f(fVar17,y_00);
      rlColor4ub(x,y,z,w);
      rlTexCoord2f(local_1d8 / (float)texShapes.width,fStack_1d4 / (float)texShapes.height);
      rlVertex2f(local_68,local_88);
      rlTexCoord2f(local_1d8 / (float)texShapes.width,fStack_1e4 / (float)texShapes.height);
      rlVertex2f(fVar18,local_88);
      rlTexCoord2f(local_1e8 / (float)texShapes.width,fStack_1e4 / (float)texShapes.height);
      rlVertex2f(fVar18,local_78);
      rlTexCoord2f(local_1e8 / (float)texShapes.width,fStack_1d4 / (float)texShapes.height);
      rlVertex2f(local_68,local_78);
      rlColor4ub(x,y,z,w);
      rlTexCoord2f(local_1d8 / (float)texShapes.width,fStack_1d4 / (float)texShapes.height);
      rlVertex2f(x_00,local_48);
      rlTexCoord2f(local_1d8 / (float)texShapes.width,fStack_1e4 / (float)texShapes.height);
      rlVertex2f(x_00,local_58);
      rlTexCoord2f(local_1e8 / (float)texShapes.width,fStack_1e4 / (float)texShapes.height);
      rlVertex2f(fVar17,local_58);
      rlTexCoord2f(local_1e8 / (float)texShapes.width,fStack_1d4 / (float)texShapes.height);
      rlVertex2f(fVar17,local_48);
      rlColor4ub(x,y,z,w);
      rlTexCoord2f(local_1d8 / (float)texShapes.width,fStack_1d4 / (float)texShapes.height);
      rlVertex2f(local_90,local_8c);
      rlTexCoord2f(local_1d8 / (float)texShapes.width,fStack_1e4 / (float)texShapes.height);
      rlVertex2f(local_d0,local_cc);
      rlTexCoord2f(local_1e8 / (float)texShapes.width,fStack_1e4 / (float)texShapes.height);
      rlVertex2f(local_d8,local_d4);
      rlTexCoord2f(local_1e8 / (float)texShapes.width,fStack_1d4 / (float)texShapes.height);
      rlVertex2f(local_98,local_94);
      rlEnd();
      rlSetTexture(0);
    }
  }
  return;
}

Assistant:

void DrawRectangleRoundedLinesEx(Rectangle rec, float roundness, int segments, float lineThick, Color color)
{
    if (lineThick < 0) lineThick = 0;

    // Not a rounded rectangle
    if (roundness <= 0.0f)
    {
        DrawRectangleLinesEx((Rectangle){rec.x-lineThick, rec.y-lineThick, rec.width+2*lineThick, rec.height+2*lineThick}, lineThick, color);
        return;
    }

    if (roundness >= 1.0f) roundness = 1.0f;

    // Calculate corner radius
    float radius = (rec.width > rec.height)? (rec.height*roundness)/2 : (rec.width*roundness)/2;
    if (radius <= 0.0f) return;

    // Calculate number of segments to use for the corners
    if (segments < 4)
    {
        // Calculate the maximum angle between segments based on the error rate (usually 0.5f)
        float th = acosf(2*powf(1 - SMOOTH_CIRCLE_ERROR_RATE/radius, 2) - 1);
        segments = (int)(ceilf(2*PI/th)/2.0f);
        if (segments <= 0) segments = 4;
    }

    float stepLength = 90.0f/(float)segments;
    const float outerRadius = radius + lineThick, innerRadius = radius;

    /*
    Quick sketch to make sense of all of this,
    marks the 16 + 4(corner centers P16-19) points we'll use

           P0 ================== P1
          // P8                P9 \\
         //                        \\
     P7 // P15                  P10 \\ P2
       ||   *P16             P17*    ||
       ||                            ||
       || P14                   P11  ||
     P6 \\  *P19             P18*   // P3
         \\                        //
          \\ P13              P12 //
           P5 ================== P4
    */
    const Vector2 point[16] = {
        {(float)rec.x + innerRadius, rec.y - lineThick}, {(float)(rec.x + rec.width) - innerRadius, rec.y - lineThick}, { rec.x + rec.width + lineThick, (float)rec.y + innerRadius }, // PO, P1, P2
        {rec.x + rec.width + lineThick, (float)(rec.y + rec.height) - innerRadius}, {(float)(rec.x + rec.width) - innerRadius, rec.y + rec.height + lineThick}, // P3, P4
        {(float)rec.x + innerRadius, rec.y + rec.height + lineThick}, { rec.x - lineThick, (float)(rec.y + rec.height) - innerRadius}, {rec.x - lineThick, (float)rec.y + innerRadius}, // P5, P6, P7
        {(float)rec.x + innerRadius, rec.y}, {(float)(rec.x + rec.width) - innerRadius, rec.y}, // P8, P9
        { rec.x + rec.width, (float)rec.y + innerRadius }, {rec.x + rec.width, (float)(rec.y + rec.height) - innerRadius}, // P10, P11
        {(float)(rec.x + rec.width) - innerRadius, rec.y + rec.height}, {(float)rec.x + innerRadius, rec.y + rec.height}, // P12, P13
        { rec.x, (float)(rec.y + rec.height) - innerRadius}, {rec.x, (float)rec.y + innerRadius} // P14, P15
    };

    const Vector2 centers[4] = {
        {(float)rec.x + innerRadius, (float)rec.y + innerRadius}, {(float)(rec.x + rec.width) - innerRadius, (float)rec.y + innerRadius}, // P16, P17
        {(float)(rec.x + rec.width) - innerRadius, (float)(rec.y + rec.height) - innerRadius}, {(float)rec.x + innerRadius, (float)(rec.y + rec.height) - innerRadius} // P18, P19
    };

    const float angles[4] = { 180.0f, 270.0f, 0.0f, 90.0f };

    if (lineThick > 1)
    {
#if defined(SUPPORT_QUADS_DRAW_MODE)
        rlSetTexture(GetShapesTexture().id);
        Rectangle shapeRect = GetShapesTextureRectangle();

        rlBegin(RL_QUADS);

            // Draw all the 4 corners first: Upper Left Corner, Upper Right Corner, Lower Right Corner, Lower Left Corner
            for (int k = 0; k < 4; ++k) // Hope the compiler is smart enough to unroll this loop
            {
                float angle = angles[k];
                const Vector2 center = centers[k];
                for (int i = 0; i < segments; i++)
                {
                    rlColor4ub(color.r, color.g, color.b, color.a);

                    rlTexCoord2f(shapeRect.x/texShapes.width, shapeRect.y/texShapes.height);
                    rlVertex2f(center.x + cosf(DEG2RAD*angle)*innerRadius, center.y + sinf(DEG2RAD*angle)*innerRadius);

                    rlTexCoord2f((shapeRect.x + shapeRect.width)/texShapes.width, shapeRect.y/texShapes.height);
                    rlVertex2f(center.x + cosf(DEG2RAD*(angle + stepLength))*innerRadius, center.y + sinf(DEG2RAD*(angle + stepLength))*innerRadius);

                    rlTexCoord2f((shapeRect.x + shapeRect.width)/texShapes.width, (shapeRect.y + shapeRect.height)/texShapes.height);
                    rlVertex2f(center.x + cosf(DEG2RAD*(angle + stepLength))*outerRadius, center.y + sinf(DEG2RAD*(angle + stepLength))*outerRadius);

                    rlTexCoord2f(shapeRect.x/texShapes.width, (shapeRect.y + shapeRect.height)/texShapes.height);
                    rlVertex2f(center.x + cosf(DEG2RAD*angle)*outerRadius, center.y + sinf(DEG2RAD*angle)*outerRadius);

                    angle += stepLength;
                }
            }

            // Upper rectangle
            rlColor4ub(color.r, color.g, color.b, color.a);
            rlTexCoord2f(shapeRect.x/texShapes.width, shapeRect.y/texShapes.height);
            rlVertex2f(point[0].x, point[0].y);
            rlTexCoord2f(shapeRect.x/texShapes.width, (shapeRect.y + shapeRect.height)/texShapes.height);
            rlVertex2f(point[8].x, point[8].y);
            rlTexCoord2f((shapeRect.x + shapeRect.width)/texShapes.width, (shapeRect.y + shapeRect.height)/texShapes.height);
            rlVertex2f(point[9].x, point[9].y);
            rlTexCoord2f((shapeRect.x + shapeRect.width)/texShapes.width, shapeRect.y/texShapes.height);
            rlVertex2f(point[1].x, point[1].y);

            // Right rectangle
            rlColor4ub(color.r, color.g, color.b, color.a);
            rlTexCoord2f(shapeRect.x/texShapes.width, shapeRect.y/texShapes.height);
            rlVertex2f(point[2].x, point[2].y);
            rlTexCoord2f(shapeRect.x/texShapes.width, (shapeRect.y + shapeRect.height)/texShapes.height);
            rlVertex2f(point[10].x, point[10].y);
            rlTexCoord2f((shapeRect.x + shapeRect.width)/texShapes.width, (shapeRect.y + shapeRect.height)/texShapes.height);
            rlVertex2f(point[11].x, point[11].y);
            rlTexCoord2f((shapeRect.x + shapeRect.width)/texShapes.width, shapeRect.y/texShapes.height);
            rlVertex2f(point[3].x, point[3].y);

            // Lower rectangle
            rlColor4ub(color.r, color.g, color.b, color.a);
            rlTexCoord2f(shapeRect.x/texShapes.width, shapeRect.y/texShapes.height);
            rlVertex2f(point[13].x, point[13].y);
            rlTexCoord2f(shapeRect.x/texShapes.width, (shapeRect.y + shapeRect.height)/texShapes.height);
            rlVertex2f(point[5].x, point[5].y);
            rlTexCoord2f((shapeRect.x + shapeRect.width)/texShapes.width, (shapeRect.y + shapeRect.height)/texShapes.height);
            rlVertex2f(point[4].x, point[4].y);
            rlTexCoord2f((shapeRect.x + shapeRect.width)/texShapes.width, shapeRect.y/texShapes.height);
            rlVertex2f(point[12].x, point[12].y);

            // Left rectangle
            rlColor4ub(color.r, color.g, color.b, color.a);
            rlTexCoord2f(shapeRect.x/texShapes.width, shapeRect.y/texShapes.height);
            rlVertex2f(point[15].x, point[15].y);
            rlTexCoord2f(shapeRect.x/texShapes.width, (shapeRect.y + shapeRect.height)/texShapes.height);
            rlVertex2f(point[7].x, point[7].y);
            rlTexCoord2f((shapeRect.x + shapeRect.width)/texShapes.width, (shapeRect.y + shapeRect.height)/texShapes.height);
            rlVertex2f(point[6].x, point[6].y);
            rlTexCoord2f((shapeRect.x + shapeRect.width)/texShapes.width, shapeRect.y/texShapes.height);
            rlVertex2f(point[14].x, point[14].y);

        rlEnd();
        rlSetTexture(0);
#else
        rlBegin(RL_TRIANGLES);

            // Draw all of the 4 corners first: Upper Left Corner, Upper Right Corner, Lower Right Corner, Lower Left Corner
            for (int k = 0; k < 4; ++k) // Hope the compiler is smart enough to unroll this loop
            {
                float angle = angles[k];
                const Vector2 center = centers[k];

                for (int i = 0; i < segments; i++)
                {
                    rlColor4ub(color.r, color.g, color.b, color.a);

                    rlVertex2f(center.x + cosf(DEG2RAD*angle)*innerRadius, center.y + sinf(DEG2RAD*angle)*innerRadius);
                    rlVertex2f(center.x + cosf(DEG2RAD*(angle + stepLength))*innerRadius, center.y + sinf(DEG2RAD*(angle + stepLength))*innerRadius);
                    rlVertex2f(center.x + cosf(DEG2RAD*angle)*outerRadius, center.y + sinf(DEG2RAD*angle)*outerRadius);

                    rlVertex2f(center.x + cosf(DEG2RAD*(angle + stepLength))*innerRadius, center.y + sinf(DEG2RAD*(angle + stepLength))*innerRadius);
                    rlVertex2f(center.x + cosf(DEG2RAD*(angle + stepLength))*outerRadius, center.y + sinf(DEG2RAD*(angle + stepLength))*outerRadius);
                    rlVertex2f(center.x + cosf(DEG2RAD*angle)*outerRadius, center.y + sinf(DEG2RAD*angle)*outerRadius);

                    angle += stepLength;
                }
            }

            // Upper rectangle
            rlColor4ub(color.r, color.g, color.b, color.a);
            rlVertex2f(point[0].x, point[0].y);
            rlVertex2f(point[8].x, point[8].y);
            rlVertex2f(point[9].x, point[9].y);
            rlVertex2f(point[1].x, point[1].y);
            rlVertex2f(point[0].x, point[0].y);
            rlVertex2f(point[9].x, point[9].y);

            // Right rectangle
            rlColor4ub(color.r, color.g, color.b, color.a);
            rlVertex2f(point[10].x, point[10].y);
            rlVertex2f(point[11].x, point[11].y);
            rlVertex2f(point[3].x, point[3].y);
            rlVertex2f(point[2].x, point[2].y);
            rlVertex2f(point[10].x, point[10].y);
            rlVertex2f(point[3].x, point[3].y);

            // Lower rectangle
            rlColor4ub(color.r, color.g, color.b, color.a);
            rlVertex2f(point[13].x, point[13].y);
            rlVertex2f(point[5].x, point[5].y);
            rlVertex2f(point[4].x, point[4].y);
            rlVertex2f(point[12].x, point[12].y);
            rlVertex2f(point[13].x, point[13].y);
            rlVertex2f(point[4].x, point[4].y);

            // Left rectangle
            rlColor4ub(color.r, color.g, color.b, color.a);
            rlVertex2f(point[7].x, point[7].y);
            rlVertex2f(point[6].x, point[6].y);
            rlVertex2f(point[14].x, point[14].y);
            rlVertex2f(point[15].x, point[15].y);
            rlVertex2f(point[7].x, point[7].y);
            rlVertex2f(point[14].x, point[14].y);
        rlEnd();
#endif
    }
    else
    {
        // Use LINES to draw the outline
        rlBegin(RL_LINES);

            // Draw all the 4 corners first: Upper Left Corner, Upper Right Corner, Lower Right Corner, Lower Left Corner
            for (int k = 0; k < 4; ++k) // Hope the compiler is smart enough to unroll this loop
            {
                float angle = angles[k];
                const Vector2 center = centers[k];

                for (int i = 0; i < segments; i++)
                {
                    rlColor4ub(color.r, color.g, color.b, color.a);
                    rlVertex2f(center.x + cosf(DEG2RAD*angle)*outerRadius, center.y + sinf(DEG2RAD*angle)*outerRadius);
                    rlVertex2f(center.x + cosf(DEG2RAD*(angle + stepLength))*outerRadius, center.y + sinf(DEG2RAD*(angle + stepLength))*outerRadius);
                    angle += stepLength;
                }
            }

            // And now the remaining 4 lines
            for (int i = 0; i < 8; i += 2)
            {
                rlColor4ub(color.r, color.g, color.b, color.a);
                rlVertex2f(point[i].x, point[i].y);
                rlVertex2f(point[i + 1].x, point[i + 1].y);
            }

        rlEnd();
    }
}